

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_dict.c
# Opt level: O0

ares_bool_t ares_htable_dict_get(ares_htable_dict_t *htable,char *key,char **val)

{
  void *pvVar1;
  ares_htable_dict_bucket_t *bucket;
  char **val_local;
  char *key_local;
  ares_htable_dict_t *htable_local;
  
  if (val != (char **)0x0) {
    *val = (char *)0x0;
  }
  if (htable == (ares_htable_dict_t *)0x0) {
    htable_local._4_4_ = ARES_FALSE;
  }
  else {
    pvVar1 = ares_htable_get(htable->hash,key);
    if (pvVar1 == (void *)0x0) {
      htable_local._4_4_ = ARES_FALSE;
    }
    else {
      if (val != (char **)0x0) {
        *val = *(char **)((long)pvVar1 + 8);
      }
      htable_local._4_4_ = ARES_TRUE;
    }
  }
  return htable_local._4_4_;
}

Assistant:

ares_bool_t ares_htable_dict_get(const ares_htable_dict_t *htable,
                                 const char *key, const char **val)
{
  const ares_htable_dict_bucket_t *bucket = NULL;

  if (val) {
    *val = NULL;
  }

  if (htable == NULL) {
    return ARES_FALSE;
  }

  bucket = ares_htable_get(htable->hash, key);
  if (bucket == NULL) {
    return ARES_FALSE;
  }

  if (val) {
    *val = bucket->val;
  }
  return ARES_TRUE;
}